

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O2

aiMeshMorphAnim * CreateMeshMorphAnim(Asset *r,Node *node,AnimationSamplers *samplers)

{
  aiMeshMorphKey *paVar1;
  undefined8 *puVar2;
  Sampler *pSVar3;
  ulong uVar4;
  size_t sVar5;
  aiMeshMorphAnim *paVar6;
  ulong *puVar7;
  long lVar8;
  uint *puVar9;
  double *pdVar10;
  ulong uVar11;
  uint i;
  ulong uVar12;
  ulong uVar13;
  aiMeshMorphKey *paVar14;
  float *values;
  aiMeshMorphAnim *local_68;
  ulong local_60;
  ulong local_58;
  float *times;
  ulong local_48;
  
  paVar6 = (aiMeshMorphAnim *)operator_new(0x410);
  (paVar6->mName).length = 0;
  (paVar6->mName).data[0] = '\0';
  memset((paVar6->mName).data + 1,0x1b,0x3ff);
  paVar6->mNumKeys = 0;
  paVar6->mKeys = (aiMeshMorphKey *)0x0;
  GetNodeName_abi_cxx11_((string *)&times,node);
  if (local_48 < 0x400) {
    (paVar6->mName).length = (ai_uint32)local_48;
    memcpy((paVar6->mName).data,times,local_48);
    (paVar6->mName).data[local_48] = '\0';
  }
  std::__cxx11::string::~string((string *)&times);
  pSVar3 = samplers->weight;
  if (pSVar3 != (Sampler *)0x0) {
    times = (float *)0x0;
    glTF2::Accessor::ExtractData<float>
              ((((pSVar3->input).vector)->
               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
               super__Vector_impl_data._M_start[(pSVar3->input).index],&times);
    values = (float *)0x0;
    glTF2::Accessor::ExtractData<float>
              ((((samplers->weight->output).vector)->
               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
               super__Vector_impl_data._M_start[(samplers->weight->output).index],&values);
    pSVar3 = samplers->weight;
    uVar4 = (((pSVar3->input).vector)->
            super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
            super__Vector_impl_data._M_start[(pSVar3->input).index]->count;
    uVar11 = uVar4 & 0xffffffff;
    paVar6->mNumKeys = (uint)uVar4;
    sVar5 = (((pSVar3->output).vector)->
            super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
            super__Vector_impl_data._M_start[(pSVar3->output).index]->count;
    puVar7 = (ulong *)operator_new__(uVar11 * 0x20 + 8);
    *puVar7 = uVar11;
    paVar14 = (aiMeshMorphKey *)(puVar7 + 1);
    lVar8 = 0;
    do {
      puVar2 = (undefined8 *)((long)puVar7 + lVar8 + 0x14);
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2 = (undefined8 *)((long)&paVar14->mTime + lVar8);
      *puVar2 = 0;
      puVar2[1] = 0;
      lVar8 = lVar8 + 0x20;
    } while (uVar11 * 0x20 != lVar8);
    uVar4 = (ulong)(uint)sVar5 / (uVar4 & 0xffffffff);
    paVar6->mKeys = paVar14;
    local_60 = uVar4 * 4;
    uVar13 = 0;
    local_68 = paVar6;
    local_58 = uVar11;
    for (uVar12 = 0; uVar12 != local_58; uVar12 = uVar12 + 1) {
      paVar1 = paVar14 + uVar12;
      paVar1->mTime = (double)(times[uVar12] * 1000.0);
      paVar1->mNumValuesAndWeights = (uint)uVar4;
      puVar9 = (uint *)operator_new__(local_60);
      paVar1->mValues = puVar9;
      pdVar10 = (double *)operator_new__(uVar4 * 8);
      paVar1->mWeights = pdVar10;
      for (uVar11 = 0; uVar11 < uVar4; uVar11 = uVar11 + 1) {
        paVar1->mValues[uVar11] = (uint)uVar11;
        paVar1->mWeights[uVar11] =
             (double)(float)(~-(uint)(values[uVar13 + uVar11 & 0xffffffff] <= 0.0) &
                            (uint)values[uVar13 + uVar11 & 0xffffffff]);
      }
      uVar13 = (ulong)((int)uVar13 + (uint)uVar11);
    }
    if (times != (float *)0x0) {
      operator_delete__(times);
    }
    paVar6 = local_68;
    if (values != (float *)0x0) {
      operator_delete__(values);
    }
  }
  return paVar6;
}

Assistant:

aiMeshMorphAnim *CreateMeshMorphAnim(glTF2::Asset &r, Node &node, AnimationSamplers &samplers) {
	aiMeshMorphAnim *anim = new aiMeshMorphAnim();
	anim->mName = GetNodeName(node);

	static const float kMillisecondsFromSeconds = 1000.f;

	if (nullptr != samplers.weight) {
		float *times = nullptr;
		samplers.weight->input->ExtractData(times);
		float *values = nullptr;
		samplers.weight->output->ExtractData(values);
		anim->mNumKeys = static_cast<uint32_t>(samplers.weight->input->count);

		const unsigned int numMorphs = (unsigned int)samplers.weight->output->count / anim->mNumKeys;

		anim->mKeys = new aiMeshMorphKey[anim->mNumKeys];
		unsigned int k = 0u;
		for (unsigned int i = 0u; i < anim->mNumKeys; ++i) {
			anim->mKeys[i].mTime = times[i] * kMillisecondsFromSeconds;
			anim->mKeys[i].mNumValuesAndWeights = numMorphs;
			anim->mKeys[i].mValues = new unsigned int[numMorphs];
			anim->mKeys[i].mWeights = new double[numMorphs];

			for (unsigned int j = 0u; j < numMorphs; ++j, ++k) {
				anim->mKeys[i].mValues[j] = j;
				anim->mKeys[i].mWeights[j] = (0.f > values[k]) ? 0.f : values[k];
			}
		}

		delete[] times;
		delete[] values;
	}

	return anim;
}